

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  cmLocalGenerator *pcVar1;
  cmGeneratorTarget *this_00;
  Entry *pEVar2;
  bool bVar3;
  TargetType TVar4;
  cmListFileBacktrace *backtrace;
  ostream *poVar5;
  const_reference pvVar6;
  char *pcVar7;
  reference pvVar8;
  reference str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  *this_01;
  pointer ppVar9;
  cmCompiledGeneratorExpression *pcVar10;
  allocator local_349;
  string local_348;
  undefined1 local_328 [8];
  string local_320;
  string local_300;
  iterator local_2e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
  local_2d8;
  iterator local_2d0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
  local_2c8;
  const_iterator i;
  cmPropertyMap *pm;
  string local_288;
  undefined1 local_268 [8];
  string local_260;
  string local_240;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  const_iterator ci;
  string local_1e8;
  undefined1 local_1c8 [8];
  string local_1c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  const_iterator ei;
  undefined1 local_160 [8];
  string emulatorExe;
  string local_138;
  undefined1 local_118 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  string local_f8;
  char *local_d8;
  char *emulator;
  cmGeneratorTarget *local_b0;
  cmGeneratorTarget *target;
  string exe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command;
  int local_4c;
  undefined1 local_48 [8];
  cmGeneratorExpression ge;
  string *config_local;
  ostream *os_local;
  cmTestGenerator *this_local;
  Indent indent_local;
  
  this->TestGenerated = true;
  ge.Backtrace.Cur = (Entry *)config;
  backtrace = cmTest::GetBacktrace(this->Test);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_48,backtrace);
  local_4c = indent.Level;
  poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar5 = std::operator<<(poVar5,"add_test(");
  cmTest::GetName_abi_cxx11_((string *)&command,this->Test);
  poVar5 = std::operator<<(poVar5,(string *)&command);
  std::operator<<(poVar5," ");
  std::__cxx11::string::~string((string *)&command);
  exe.field_2._8_8_ = cmTest::GetCommand_abi_cxx11_(this->Test);
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)exe.field_2._8_8_,0);
  std::__cxx11::string::string((string *)&target,(string *)pvVar6);
  local_b0 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,(string *)&target);
  if ((local_b0 == (cmGeneratorTarget *)0x0) ||
     (TVar4 = cmGeneratorTarget::GetType(local_b0), TVar4 != EXECUTABLE)) {
    std::__cxx11::string::c_str();
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_1c8,local_48);
    pcVar10 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)local_1c8);
    pEVar2 = ge.Backtrace.Cur;
    pcVar1 = this->LG;
    std::__cxx11::string::string((string *)&local_1e8);
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar10,pcVar1,(string *)pEVar2,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_1e8);
    std::__cxx11::string::operator=((string *)&target,pcVar7);
    std::__cxx11::string::~string((string *)&local_1e8);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_1c8);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&target);
  }
  else {
    cmGeneratorTarget::GetFullPath
              ((string *)&emulator,local_b0,(string *)ge.Backtrace.Cur,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=((string *)&target,(string *)&emulator);
    std::__cxx11::string::~string((string *)&emulator);
    this_00 = local_b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f8,"CROSSCOMPILING_EMULATOR",
               (allocator *)
               ((long)&emulatorWithArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar7 = cmGeneratorTarget::GetProperty(this_00,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&emulatorWithArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_d8 = pcVar7;
    if (pcVar7 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_118);
      pcVar7 = local_d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_138,pcVar7,(allocator *)(emulatorExe.field_2._M_local_buf + 0xf));
      cmSystemTools::ExpandListArgument
                (&local_138,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_118,false);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)(emulatorExe.field_2._M_local_buf + 0xf));
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_118,0);
      std::__cxx11::string::string((string *)local_160,(string *)pvVar8);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_160);
      cmOutputConverter::EscapeForCMake((string *)&ei,(string *)local_160);
      poVar5 = std::operator<<(os,(string *)&ei);
      std::operator<<(poVar5," ");
      std::__cxx11::string::~string((string *)&ei);
      local_198._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_118);
      local_190 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(&local_198,1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_188,&local_190);
      while( true ) {
        local_1a0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_118);
        bVar3 = __gnu_cxx::operator!=(&local_188,&local_1a0);
        if (!bVar3) break;
        str = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_188);
        cmOutputConverter::EscapeForCMake((string *)(local_1c8 + 8),str);
        poVar5 = std::operator<<(os,(string *)(local_1c8 + 8));
        std::operator<<(poVar5," ");
        std::__cxx11::string::~string((string *)(local_1c8 + 8));
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_188);
      }
      std::__cxx11::string::~string((string *)local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
    }
  }
  cmOutputConverter::EscapeForCMake((string *)&ci,(string *)&target);
  std::operator<<(os,(string *)&ci);
  std::__cxx11::string::~string((string *)&ci);
  local_218._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)exe.field_2._8_8_);
  local_210 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator+(&local_218,1);
  while( true ) {
    local_220._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)exe.field_2._8_8_);
    bVar3 = __gnu_cxx::operator!=(&local_210,&local_220);
    if (!bVar3) break;
    poVar5 = std::operator<<(os," ");
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_210);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_268,(string *)local_48);
    pcVar10 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)local_268);
    pEVar2 = ge.Backtrace.Cur;
    pcVar1 = this->LG;
    std::__cxx11::string::string((string *)&local_288);
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar10,pcVar1,(string *)pEVar2,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_288);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_268 + 8),pcVar7,(allocator *)((long)&pm + 7));
    cmOutputConverter::EscapeForCMake(&local_240,(string *)(local_268 + 8));
    std::operator<<(poVar5,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)(local_268 + 8));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pm + 7));
    std::__cxx11::string::~string((string *)&local_288);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_268);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_210);
  }
  std::operator<<(os,")\n");
  this_01 = &cmTest::GetProperties(this->Test)->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ;
  bVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
          ::empty(this_01);
  if (!bVar3) {
    poVar5 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar5 = std::operator<<(poVar5,"set_tests_properties(");
    cmTest::GetName_abi_cxx11_((string *)&i,this->Test);
    poVar5 = std::operator<<(poVar5,(string *)&i);
    std::operator<<(poVar5," PROPERTIES ");
    std::__cxx11::string::~string((string *)&i);
    local_2d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         ::begin(this_01);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
    ::_Rb_tree_const_iterator(&local_2c8,&local_2d0);
    while( true ) {
      local_2e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ::end(this_01);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
      ::_Rb_tree_const_iterator(&local_2d8,&local_2e0);
      bVar3 = std::operator!=(&local_2c8,&local_2d8);
      if (!bVar3) break;
      poVar5 = std::operator<<(os," ");
      ppVar9 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
               ::operator->(&local_2c8);
      poVar5 = std::operator<<(poVar5,(string *)ppVar9);
      poVar5 = std::operator<<(poVar5," ");
      ppVar9 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
               ::operator->(&local_2c8);
      cmProperty::GetValue(&ppVar9->second);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_328,local_48);
      pcVar10 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                          ((auto_ptr<cmCompiledGeneratorExpression> *)local_328);
      pEVar2 = ge.Backtrace.Cur;
      pcVar1 = this->LG;
      std::__cxx11::string::string((string *)&local_348);
      pcVar7 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar10,pcVar1,(string *)pEVar2,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_348
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_328 + 8),pcVar7,&local_349);
      cmOutputConverter::EscapeForCMake(&local_300,(string *)(local_328 + 8));
      std::operator<<(poVar5,(string *)&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)(local_328 + 8));
      std::allocator<char>::~allocator((allocator<char> *)&local_349);
      std::__cxx11::string::~string((string *)&local_348);
      ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_328);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
      ::operator++(&local_2c8);
    }
    poVar5 = std::operator<<(os,")");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)&target);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_48);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(this->Test->GetBacktrace());

  // Start the test command.
  os << indent << "add_test(" << this->Test->GetName() << " ";

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = command[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    // Prepend with the emulator when cross compiling if required.
    const char* emulator = target->GetProperty("CROSSCOMPILING_EMULATOR");
    if (emulator != CM_NULLPTR) {
      std::vector<std::string> emulatorWithArgs;
      cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
      std::string emulatorExe(emulatorWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(emulatorExe);
      os << cmOutputConverter::EscapeForCMake(emulatorExe) << " ";
      for (std::vector<std::string>::const_iterator ei =
             emulatorWithArgs.begin() + 1;
           ei != emulatorWithArgs.end(); ++ei) {
        os << cmOutputConverter::EscapeForCMake(*ei) << " ";
      }
    }
  } else {
    // Use the command name given.
    exe = ge.Parse(exe.c_str())->Evaluate(this->LG, config);
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);
  for (std::vector<std::string>::const_iterator ci = command.begin() + 1;
       ci != command.end(); ++ci) {
    os << " " << cmOutputConverter::EscapeForCMake(
                   ge.Parse(*ci)->Evaluate(this->LG, config));
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  if (!pm.empty()) {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
    for (cmPropertyMap::const_iterator i = pm.begin(); i != pm.end(); ++i) {
      os << " " << i->first << " "
         << cmOutputConverter::EscapeForCMake(
              ge.Parse(i->second.GetValue())->Evaluate(this->LG, config));
    }
    os << ")" << std::endl;
  }
}